

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.h
# Opt level: O0

bool __thiscall
Memory::HeapInfo::IsPageHeapEnabled<(Memory::ObjectInfoBits)256>(HeapInfo *this,size_t size)

{
  bool bVar1;
  size_t sizeCat_00;
  HeapBucket *pHVar2;
  BucketType *bucket_1;
  BucketType *bucket;
  size_t sizeCat;
  size_t size_local;
  HeapInfo *this_local;
  
  bVar1 = IsPageHeapEnabled(this);
  if (bVar1) {
    sizeCat_00 = GetAlignedSizeNoCheck(size);
    bVar1 = IsSmallObject(size);
    if (bVar1) {
      pHVar2 = (HeapBucket *)GetBucket<(Memory::ObjectInfoBits)256>(this,sizeCat_00);
      this_local._7_1_ = HeapBucket::IsPageHeapEnabled(pHVar2,WithBarrierBit);
    }
    else {
      bVar1 = IsMediumObject(size);
      if (bVar1) {
        pHVar2 = (HeapBucket *)GetMediumBucket<(Memory::ObjectInfoBits)256>(this,sizeCat_00);
        this_local._7_1_ = HeapBucket::IsPageHeapEnabled(pHVar2,WithBarrierBit);
      }
      else {
        this_local._7_1_ =
             HeapBucket::IsPageHeapEnabled
                       (&(this->largeObjectBucket).super_HeapBucket,WithBarrierBit);
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool IsPageHeapEnabled(size_t size)
    {
        if (IsPageHeapEnabled())
        {
            size_t sizeCat = HeapInfo::GetAlignedSizeNoCheck(size);
            if (HeapInfo::IsSmallObject(size))
            {
                auto& bucket = this->GetBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
                return bucket.IsPageHeapEnabled(attributes);
            }
            else if (HeapInfo::IsMediumObject(size))
            {
                auto& bucket = this->GetMediumBucket<(ObjectInfoBits)(attributes & GetBlockTypeBitMask)>(sizeCat);
                return bucket.IsPageHeapEnabled(attributes);
            }
            else
            {
                return this->largeObjectBucket.IsPageHeapEnabled(attributes);
            }
        }
        return false;
    }